

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV2AnimationBlock(Parser *this,BaseNode *mesh)

{
  Animation *pAVar1;
  byte *pbVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  Logger *pLVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  Animation *anim;
  string temp;
  string local_50;
  
  anim = &mesh->mAnim;
  pAVar1 = &mesh->mTargetAnim;
  iVar10 = 0;
LAB_00412293:
LAB_004122b4:
  pcVar11 = this->filePtr;
  if (*pcVar11 != '*') goto LAB_004124b5;
  this->filePtr = pcVar11 + 1;
  iVar5 = strncmp("NODE_NAME",pcVar11 + 1,9);
  if (iVar5 == 0) {
    bVar3 = pcVar11[10];
    if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0))
    goto LAB_00412650;
  }
  pcVar11 = this->filePtr;
  iVar5 = strncmp("CONTROL_POS_TRACK",pcVar11,0x11);
  if (iVar5 == 0) {
    bVar3 = pcVar11[0x11];
    if ((0x20 < (ulong)bVar3) || ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
    goto LAB_0041230e;
    pcVar9 = pcVar11 + 0x11;
    pcVar11 = pcVar11 + 0x12;
LAB_00412493:
    if (bVar3 == 0) {
      pcVar11 = pcVar9;
    }
    this->filePtr = pcVar11;
    if (anim == (Animation *)0x0) {
LAB_00412633:
      SkipSection(this);
    }
    else {
      ParseLV3PosAnimationBlock(this,anim);
    }
  }
  else {
LAB_0041230e:
    pcVar11 = this->filePtr;
    iVar5 = strncmp("CONTROL_POS_BEZIER",pcVar11,0x12);
    if (iVar5 == 0) {
      bVar3 = pcVar11[0x12];
      if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
        pcVar9 = pcVar11 + 0x12;
        pcVar11 = pcVar11 + 0x13;
        goto LAB_00412493;
      }
    }
    pcVar11 = this->filePtr;
    iVar5 = strncmp("CONTROL_POS_TCB",pcVar11,0xf);
    if (iVar5 == 0) {
      bVar3 = pcVar11[0xf];
      if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
        pcVar9 = pcVar11 + 0xf;
        pcVar11 = pcVar11 + 0x10;
        goto LAB_00412493;
      }
    }
    pcVar11 = this->filePtr;
    iVar5 = strncmp("CONTROL_SCALE_TRACK",pcVar11,0x13);
    if (iVar5 == 0) {
      bVar3 = pcVar11[0x13];
      if ((0x20 < (ulong)bVar3) || ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
      goto LAB_0041236b;
      pcVar9 = pcVar11 + 0x13;
      pcVar11 = pcVar11 + 0x14;
LAB_00412541:
      if (bVar3 == 0) {
        pcVar11 = pcVar9;
      }
      this->filePtr = pcVar11;
      if (anim == pAVar1 || anim == (Animation *)0x0) {
        pLVar6 = DefaultLogger::get();
        pcVar11 = "ASE: Ignoring scaling channel in target animation";
        goto LAB_0041262e;
      }
      ParseLV3ScaleAnimationBlock(this,anim);
    }
    else {
LAB_0041236b:
      pcVar11 = this->filePtr;
      iVar5 = strncmp("CONTROL_SCALE_BEZIER",pcVar11,0x14);
      if (iVar5 == 0) {
        bVar3 = pcVar11[0x14];
        if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
          pcVar9 = pcVar11 + 0x14;
          pcVar11 = pcVar11 + 0x15;
          goto LAB_00412541;
        }
      }
      pcVar11 = this->filePtr;
      iVar5 = strncmp("CONTROL_SCALE_TCB",pcVar11,0x11);
      if (iVar5 == 0) {
        bVar3 = pcVar11[0x11];
        if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
          pcVar9 = pcVar11 + 0x11;
          pcVar11 = pcVar11 + 0x12;
          goto LAB_00412541;
        }
      }
      pcVar11 = this->filePtr;
      iVar5 = strncmp("CONTROL_ROT_TRACK",pcVar11,0x11);
      if (iVar5 == 0) {
        bVar3 = pcVar11[0x11];
        if ((0x20 < (ulong)bVar3) || ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
        goto LAB_004123c8;
        pcVar9 = pcVar11 + 0x11;
        pcVar11 = pcVar11 + 0x12;
LAB_0041260f:
        if (bVar3 == 0) {
          pcVar11 = pcVar9;
        }
        this->filePtr = pcVar11;
        if (anim == pAVar1 || anim == (Animation *)0x0) {
          pLVar6 = DefaultLogger::get();
          pcVar11 = "ASE: Ignoring rotation channel in target animation";
LAB_0041262e:
          Logger::error(pLVar6,pcVar11);
          goto LAB_00412633;
        }
        ParseLV3RotAnimationBlock(this,anim);
      }
      else {
LAB_004123c8:
        pcVar11 = this->filePtr;
        iVar5 = strncmp("CONTROL_ROT_BEZIER",pcVar11,0x12);
        if (iVar5 == 0) {
          bVar3 = pcVar11[0x12];
          if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
            pcVar9 = pcVar11 + 0x12;
            pcVar11 = pcVar11 + 0x13;
            goto LAB_0041260f;
          }
        }
        pcVar11 = this->filePtr;
        iVar5 = strncmp("CONTROL_ROT_TCB",pcVar11,0xf);
        if (iVar5 == 0) {
          bVar3 = pcVar11[0xf];
          if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
            pcVar9 = pcVar11 + 0xf;
            pcVar11 = pcVar11 + 0x10;
            goto LAB_0041260f;
          }
        }
LAB_004124b5:
        pbVar2 = (byte *)this->filePtr;
        bVar3 = *pbVar2;
        uVar8 = (uint)bVar3;
        if (bVar3 == 0x7b) {
          iVar10 = iVar10 + 1;
        }
        else if (bVar3 == 0x7d) {
          iVar10 = iVar10 + -1;
          if (iVar10 == 0) {
            this->filePtr = (char *)(pbVar2 + 1);
            SkipToNextToken(this);
            return;
          }
        }
        else if (uVar8 == 0) {
          LogError(this,"Encountered unexpected EOL while parsing a TM_ANIMATION chunk (Level 2)");
        }
        if (((uVar8 < 0xe) && ((0x3401U >> (uVar8 & 0x1f) & 1) != 0)) &&
           (this->bLastWasEndLine == false)) {
          this->iLineNumber = this->iLineNumber + 1;
          this->bLastWasEndLine = true;
        }
        else {
          this->bLastWasEndLine = false;
        }
        this->filePtr = (char *)(pbVar2 + 1);
      }
    }
  }
  goto LAB_004122b4;
LAB_00412650:
  this->filePtr = pcVar11 + (0xb - (ulong)(bVar3 == 0));
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar4 = ParseString(this,&local_50,"*NODE_NAME");
  if (!bVar4) {
    SkipToNextToken(this);
  }
  lVar7 = std::__cxx11::string::find((char *)&local_50,0x6dbddd,0);
  if (lVar7 == -1) goto LAB_00412709;
  if (mesh->mType == Light) {
    iVar5 = *(int *)&mesh->field_0x154;
joined_r0x004126f0:
    anim = pAVar1;
    if (iVar5 == 1) goto LAB_00412709;
  }
  else if (mesh->mType == Camera) {
    iVar5 = *(int *)&mesh[1].mName._M_dataplus._M_p;
    goto joined_r0x004126f0;
  }
  pLVar6 = DefaultLogger::get();
  Logger::error(pLVar6,
                "ASE: Found target animation channel but the node is neither a camera nor a spot light"
               );
  anim = (Animation *)0x0;
LAB_00412709:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  goto LAB_00412293;
}

Assistant:

void Parser::ParseLV2AnimationBlock(ASE::BaseNode& mesh)
{
    AI_ASE_PARSER_INIT();

    ASE::Animation* anim = &mesh.mAnim;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                std::string temp;
                if(!ParseString(temp,"*NODE_NAME"))
                    SkipToNextToken();

                // If the name of the node contains .target it
                // represents an animated camera or spot light
                // target.
                if (std::string::npos != temp.find(".Target"))
                {
                    if  ((mesh.mType != BaseNode::Camera || ((ASE::Camera&)mesh).mCameraType != ASE::Camera::TARGET)  &&
                        ( mesh.mType != BaseNode::Light  || ((ASE::Light&)mesh).mLightType   != ASE::Light::TARGET))
                    {

                        ASSIMP_LOG_ERROR("ASE: Found target animation channel "
                            "but the node is neither a camera nor a spot light");
                        anim = NULL;
                    }
                    else anim = &mesh.mTargetAnim;
                }
                continue;
            }

            // position keyframes
            if (TokenMatch(filePtr,"CONTROL_POS_TRACK"  ,17)  ||
                TokenMatch(filePtr,"CONTROL_POS_BEZIER" ,18)  ||
                TokenMatch(filePtr,"CONTROL_POS_TCB"    ,15))
            {
                if (!anim)SkipSection();
                else ParseLV3PosAnimationBlock(*anim);
                continue;
            }
            // scaling keyframes
            if (TokenMatch(filePtr,"CONTROL_SCALE_TRACK"  ,19) ||
                TokenMatch(filePtr,"CONTROL_SCALE_BEZIER" ,20) ||
                TokenMatch(filePtr,"CONTROL_SCALE_TCB"    ,17))
            {
                if (!anim || anim == &mesh.mTargetAnim)
                {
                    // Target animation channels may have no rotation channels
                    ASSIMP_LOG_ERROR("ASE: Ignoring scaling channel in target animation");
                    SkipSection();
                }
                else ParseLV3ScaleAnimationBlock(*anim);
                continue;
            }
            // rotation keyframes
            if (TokenMatch(filePtr,"CONTROL_ROT_TRACK"  ,17) ||
                TokenMatch(filePtr,"CONTROL_ROT_BEZIER" ,18) ||
                TokenMatch(filePtr,"CONTROL_ROT_TCB"    ,15))
            {
                if (!anim || anim == &mesh.mTargetAnim)
                {
                    // Target animation channels may have no rotation channels
                    ASSIMP_LOG_ERROR("ASE: Ignoring rotation channel in target animation");
                    SkipSection();
                }
                else ParseLV3RotAnimationBlock(*anim);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","TM_ANIMATION");
    }
}